

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Parser::parse(MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *__return_storage_ptr__,Parser *this,string *input)

{
  SQLStateMachine *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  runtime_error *prVar7;
  bool bVar8;
  string _token_string;
  string key;
  string token_string;
  Token t;
  string local_e0;
  Token local_c0;
  string local_98;
  Token local_78;
  char *local_50 [2];
  char local_40 [16];
  
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::BPlusTree(&__return_storage_ptr__->tree,true);
  set_string(this,input);
  this_00 = &this->sql_state;
  SQLStateMachine::reset_state(this_00);
  if ((this->tokens)._size != 0) {
    do {
      Queue<string_tokenizer::Token>::pop(&local_78,&this->tokens);
      while( true ) {
        if ((this->tokens)._size == 0) {
          bVar8 = false;
        }
        else {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,local_78._token._M_dataplus._M_p,
                     local_78._token._M_dataplus._M_p + local_78._token._M_string_length);
          iVar3 = isspace((int)*local_50[0]);
          bVar8 = iVar3 != 0;
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        }
        if (!bVar8) break;
        Queue<string_tokenizer::Token>::pop(&local_c0,&this->tokens);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_c0);
        local_78._type = local_c0._type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._token._M_dataplus._M_p != &local_c0._token.field_2) {
          operator_delete(local_c0._token._M_dataplus._M_p);
        }
      }
      paVar1 = &local_c0._token.field_2;
      local_c0._token._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_78._token._M_dataplus._M_p,
                 local_78._token._M_dataplus._M_p + local_78._token._M_string_length);
      _Var2._M_p = local_c0._token._M_dataplus._M_p;
      iVar3 = isspace((int)*local_c0._token._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != paVar1) {
        operator_delete(_Var2._M_p);
      }
      if (iVar3 == 0) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,local_78._token._M_dataplus._M_p,
                   local_78._token._M_dataplus._M_p + local_78._token._M_string_length);
        iVar4 = SQLStateMachine::update_state(this_00,&local_98);
        bVar8 = SQLStateMachine::is_quote_state(this_00,iVar4);
        if (bVar8) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_98,0,(char *)local_98._M_string_length,0x11b0ef);
          while (((this->tokens)._size != 0 &&
                 (bVar8 = SQLStateMachine::is_quote_state(this_00,iVar4), bVar8))) {
            Queue<string_tokenizer::Token>::pop(&local_c0,&this->tokens);
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,local_c0._token._M_dataplus._M_p,
                       local_c0._token._M_dataplus._M_p + local_c0._token._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._token._M_dataplus._M_p != paVar1) {
              operator_delete(local_c0._token._M_dataplus._M_p);
            }
            iVar4 = SQLStateMachine::update_state(this_00,&local_e0);
            iVar5 = std::__cxx11::string::compare((char *)&local_e0);
            if (iVar5 != 0) {
              std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_e0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
          }
          bVar8 = SQLStateMachine::is_quote_state(this_00,iVar4);
          if (bVar8) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,this->NO_CLOSING_QUOTE);
            __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        bVar8 = SQLStateMachine::is_invalid(this_00);
        if (bVar8) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_c0._token,this->UNEXPECTED_TOKEN,&local_98);
          std::runtime_error::runtime_error(prVar7,(string *)&local_c0);
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        SQLStateMachine::get_parse_key_abi_cxx11_(&local_c0._token,this_00,iVar4);
        iVar4 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar4 != 0) {
          iVar4 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar4 == 0) {
            string_util::uppercase(&local_e0,&local_98);
            pvVar6 = MultiMap::
                     MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::at(__return_storage_ptr__,&local_c0._token);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pvVar6,&local_e0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p);
            }
          }
          else {
            pvVar6 = MultiMap::
                     MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::at(__return_storage_ptr__,&local_c0._token);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pvVar6,&local_98);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._token._M_dataplus._M_p != paVar1) {
          operator_delete(local_c0._token._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._token._M_dataplus._M_p != &local_78._token.field_2) {
        operator_delete(local_78._token._M_dataplus._M_p);
      }
    } while ((iVar3 == 0) && ((this->tokens)._size != 0));
  }
  bVar8 = SQLStateMachine::is_invalid(this_00);
  if ((!bVar8) && (bVar8 = SQLStateMachine::is_success(this_00), bVar8)) {
    return __return_storage_ptr__;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,this->END_OF_INPUT);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MultiMap::MultiMap<std::string, std::string> Parser::parse(const std::string& input) {
    MultiMap::MultiMap<std::string, std::string> parse_tree;
    set_string(input);
    sql_state.reset_state();
    int last_state = sql_state.get_state();
    while (!tokens.empty()) {
        string_tokenizer::Token t = tokens.pop();

        while (!tokens.empty() && isspace(t.token_str()[0])) {
            t = tokens.pop();
        }
        // we somehow exited the while loop with spaces, it's probably not
        // supposed to be there
        if (isspace(t.token_str()[0]))
            break;

        std::string token_string = t.token_str();
        last_state = sql_state.update_state(token_string);

        if (sql_state.is_quote_state(last_state)) {
            token_string = "";
            while (!tokens.empty() && sql_state.is_quote_state(last_state)) {
                std::string _token_string = tokens.pop().token_str();
                last_state = sql_state.update_state(_token_string);
                if (_token_string != "\"")
                    token_string += _token_string;
            }
            // we exited this loop while never finding a closing quote
            if (sql_state.is_quote_state(last_state))
                throw std::runtime_error(NO_CLOSING_QUOTE);
        }


        if (sql_state.is_invalid())
            throw std::runtime_error(UNEXPECTED_TOKEN + token_string);
        else {
            std::string key = sql_state.get_parse_key(last_state);
            if (key != "") {
                if (key == "command")
                    parse_tree[key] += string_util::uppercase(token_string);
                else
                    parse_tree[key] += token_string;
            }
        }
    }
    if (sql_state.is_invalid() || !sql_state.is_success()) {
        throw std::runtime_error(END_OF_INPUT);
    }
    #ifdef DEBUG
        std::cout << parse_tree << std::endl;
    #endif
    return parse_tree;
}